

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O2

void test_14(QPDF *pdf,char *arg2)

{
  bool bVar1;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *__x;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  long lVar3;
  QPDFObjGen QVar4;
  element_type *peVar5;
  ostream *poVar6;
  Buffer *this;
  FILE *__s;
  void *__ptr;
  size_t __size;
  logic_error *this_00;
  int iVar7;
  char *__s_00;
  QPDFObjectHandle QVar8;
  QPDFObjectHandle QVar9;
  allocator<char> local_159;
  string filename;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
  dict_items;
  QPDFObjectHandle qdict;
  QPDFWriter w;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e8 [3];
  QPDFObjectHandle qarray;
  value_type orig_page3;
  value_type orig_page2;
  QPDFObjectHandle new_dict;
  QPDFObjectHandle trailer;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> array_elements;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> pages;
  undefined1 local_50 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  undefined1 local_40 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  __x = (vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)QPDF::getAllPages();
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::vector(&pages,__x);
  if ((long)pages.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)pages.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
            super__Vector_impl_data._M_start != 0x40) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"test 14 not called 4-page file");
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  p_Var2 = (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
           std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at(&pages,1);
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&orig_page2,p_Var2);
  p_Var2 = (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
           std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at(&pages,2);
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&orig_page3,p_Var2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&dict_items,"/OrigPage",(allocator<char> *)&w);
  QPDFObjectHandle::getKey((string *)&filename);
  lVar3 = QPDFObjectHandle::getIntValue();
  if (lVar3 != 2) {
    __assert_fail("orig_page2.getKey(\"/OrigPage\").getIntValue() == 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,600,"void test_14(QPDF &, const char *)");
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&filename._M_string_length);
  std::__cxx11::string::~string((string *)&dict_items);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&dict_items,"/OrigPage",(allocator<char> *)&w);
  QPDFObjectHandle::getKey((string *)&filename);
  lVar3 = QPDFObjectHandle::getIntValue();
  if (lVar3 != 3) {
    __assert_fail("orig_page3.getKey(\"/OrigPage\").getIntValue() == 3",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x259,"void test_14(QPDF &, const char *)");
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&filename._M_string_length);
  std::__cxx11::string::~string((string *)&dict_items);
  QVar4 = (QPDFObjGen)QPDFObjectHandle::getObjGen();
  QPDFObjectHandle::getObjGen();
  QPDF::swapObjects((QPDFObjGen)pdf,QVar4);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&dict_items,"/OrigPage",(allocator<char> *)&w);
  QPDFObjectHandle::getKey((string *)&filename);
  lVar3 = QPDFObjectHandle::getIntValue();
  if (lVar3 == 3) {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&filename._M_string_length);
    std::__cxx11::string::~string((string *)&dict_items);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&dict_items,"/OrigPage",(allocator<char> *)&w);
    QPDFObjectHandle::getKey((string *)&filename);
    lVar3 = QPDFObjectHandle::getIntValue();
    if (lVar3 == 2) {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&filename._M_string_length);
      std::__cxx11::string::~string((string *)&dict_items);
      QPDF::getTrailer();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&dict_items,"/QDict",(allocator<char> *)&filename);
      QPDFObjectHandle::getKey((string *)&qdict);
      std::__cxx11::string::~string((string *)&dict_items);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&dict_items,"/QArray",(allocator<char> *)&filename);
      QPDFObjectHandle::getKey((string *)&qarray);
      std::__cxx11::string::~string((string *)&dict_items);
      QPDFObjectHandle::isDictionary();
      QPDFObjectHandle::newDictionary();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&dict_items,"/NewDict",(allocator<char> *)&w);
      QPDFObjectHandle::newInteger((longlong)&filename);
      QPDFObjectHandle::replaceKey((string *)&new_dict,(QPDFObjectHandle *)&dict_items);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&filename._M_string_length);
      std::__cxx11::string::~string((string *)&dict_items);
      peVar5 = (element_type *)QPDFObjectHandle::getObjGen();
      std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)local_40,
                 (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&qdict);
      QVar8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40;
      QVar8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           peVar5;
      QPDF::replaceObject((QPDFObjGen)pdf,QVar8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
      peVar5 = (element_type *)QPDFObjectHandle::getObjGen();
      std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)local_50,
                 (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&new_dict);
      QVar9.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50;
      QVar9.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           peVar5;
      QPDF::replaceObject((QPDFObjGen)pdf,QVar9);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48);
      poVar6 = std::operator<<((ostream *)&std::cout,"old dict: ");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&dict_items,"/NewDict",(allocator<char> *)&w);
      QPDFObjectHandle::getKey((string *)&filename);
      QPDFObjectHandle::getIntValue();
      poVar6 = std::ostream::_M_insert<long_long>((longlong)poVar6);
      std::endl<char,std::char_traits<char>>(poVar6);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&filename._M_string_length);
      std::__cxx11::string::~string((string *)&dict_items);
      QVar4 = (QPDFObjGen)QPDFObjectHandle::getObjGen();
      QPDFObjectHandle::getObjGen();
      QPDF::swapObjects((QPDFObjGen)pdf,QVar4);
      poVar6 = std::operator<<((ostream *)&std::cout,"swapped array: ");
      QPDFObjectHandle::getArrayItem((int)&filename);
      QPDFObjectHandle::getName_abi_cxx11_();
      poVar6 = std::operator<<(poVar6,(string *)&dict_items);
      std::endl<char,std::char_traits<char>>(poVar6);
      std::__cxx11::string::~string((string *)&dict_items);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&filename._M_string_length);
      poVar6 = std::operator<<((ostream *)&std::cout,"new dict: ");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&dict_items,"/NewDict",(allocator<char> *)&w);
      QPDFObjectHandle::getKey((string *)&filename);
      QPDFObjectHandle::getIntValue();
      poVar6 = std::ostream::_M_insert<long_long>((longlong)poVar6);
      std::endl<char,std::char_traits<char>>(poVar6);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&filename._M_string_length);
      std::__cxx11::string::~string((string *)&dict_items);
      QPDFObjectHandle::getObjGen();
      QPDF::getObjectByObjGen((QPDFObjGen)&dict_items);
      std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&qdict,
                 (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&dict_items);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &dict_items._M_t._M_impl.super__Rb_tree_header);
      poVar6 = std::operator<<((ostream *)&std::cout,"swapped array: ");
      QPDFObjectHandle::getArrayItem((int)&filename);
      QPDFObjectHandle::getName_abi_cxx11_();
      poVar6 = std::operator<<(poVar6,(string *)&dict_items);
      std::endl<char,std::char_traits<char>>(poVar6);
      std::__cxx11::string::~string((string *)&dict_items);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&filename._M_string_length);
      QPDFObjectHandle::getArrayAsVector();
      QPDFObjectHandle::getDictAsMap_abi_cxx11_();
      if ((long)array_elements.
                super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)array_elements.
                super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
                super__Vector_impl_data._M_start == 0x10) {
        std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at(&array_elements,0);
        QPDFObjectHandle::getName_abi_cxx11_();
        bVar1 = std::operator==(&filename,"/Array");
        if ((bVar1) && (dict_items._M_t._M_impl.super__Rb_tree_header._M_node_count == 1)) {
          std::__cxx11::string::string<std::allocator<char>>((string *)&w,"/NewDict",&local_159);
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
          ::operator[](&dict_items,(key_type *)&w);
          lVar3 = QPDFObjectHandle::getIntValue();
          std::__cxx11::string::~string((string *)&w);
          std::__cxx11::string::~string((string *)&filename);
          if (lVar3 == 2) {
            poVar6 = std::operator<<((ostream *)&std::cout,
                                     "array and dictionary contents are correct");
            std::endl<char,std::char_traits<char>>(poVar6);
          }
        }
        else {
          std::__cxx11::string::~string((string *)&filename);
        }
      }
      iVar7 = 2;
      while (iVar7 != 0) {
        QPDFWriter::QPDFWriter(&w,pdf);
        QPDFWriter::setOutputMemory();
        QPDFWriter::setStaticID(SUB81(&w,0));
        QPDFWriter::setStreamDataMode((qpdf_stream_data_e)&w);
        QPDFWriter::write();
        this = (Buffer *)QPDFWriter::getBuffer();
        __s_00 = "b.pdf";
        if (iVar7 == 2) {
          __s_00 = "a.pdf";
        }
        std::__cxx11::string::string<std::allocator<char>>((string *)&filename,__s_00,&local_159);
        __s = (FILE *)QUtil::safe_fopen(filename._M_dataplus._M_p,"wb");
        __ptr = (void *)Buffer::getBuffer();
        __size = Buffer::getSize();
        fwrite(__ptr,__size,1,__s);
        fclose(__s);
        Buffer::~Buffer(this);
        operator_delete(this,8);
        std::__cxx11::string::~string((string *)&filename);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_e8);
        iVar7 = iVar7 + -1;
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
      ::~_Rb_tree(&dict_items._M_t);
      std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector(&array_elements);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&new_dict.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&qarray.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&qdict.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&trailer.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&orig_page3.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&orig_page2.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector(&pages);
      return;
    }
    __assert_fail("orig_page3.getKey(\"/OrigPage\").getIntValue() == 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x25c,"void test_14(QPDF &, const char *)");
  }
  __assert_fail("orig_page2.getKey(\"/OrigPage\").getIntValue() == 3",
                "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc",
                0x25b,"void test_14(QPDF &, const char *)");
}

Assistant:

static void
test_14(QPDF& pdf, char const* arg2)
{
    // Exercise swap and replace.  This test case is designed for
    // a specific file.
    std::vector<QPDFObjectHandle> pages = pdf.getAllPages();
    if (pages.size() != 4) {
        throw std::logic_error("test 14 not called 4-page file");
    }
    // Swap pages 2 and 3
    auto orig_page2 = pages.at(1);
    auto orig_page3 = pages.at(2);
    assert(orig_page2.getKey("/OrigPage").getIntValue() == 2);
    assert(orig_page3.getKey("/OrigPage").getIntValue() == 3);
    pdf.swapObjects(orig_page2.getObjGen(), orig_page3.getObjGen());
    assert(orig_page2.getKey("/OrigPage").getIntValue() == 3);
    assert(orig_page3.getKey("/OrigPage").getIntValue() == 2);
    // Replace object and swap objects
    QPDFObjectHandle trailer = pdf.getTrailer();
    QPDFObjectHandle qdict = trailer.getKey("/QDict");
    QPDFObjectHandle qarray = trailer.getKey("/QArray");
    // Force qdict but not qarray to resolve
    qdict.isDictionary();
    QPDFObjectHandle new_dict = QPDFObjectHandle::newDictionary();
    new_dict.replaceKey("/NewDict", QPDFObjectHandle::newInteger(2));
    try {
        // Do it wrong first...
        pdf.replaceObject(qdict.getObjGen(), qdict);
    } catch (std::logic_error const&) {
        std::cout << "caught logic error as expected" << std::endl;
    }
    pdf.replaceObject(qdict.getObjGen(), new_dict);
    // Now qdict points to the new dictionary
    std::cout << "old dict: " << qdict.getKey("/NewDict").getIntValue() << std::endl;
    // Swap dict and array
    pdf.swapObjects(qdict.getObjGen(), qarray.getObjGen());
    // Now qarray will resolve to new object and qdict resolves to
    // the array
    std::cout << "swapped array: " << qdict.getArrayItem(0).getName() << std::endl;
    std::cout << "new dict: " << qarray.getKey("/NewDict").getIntValue() << std::endl;
    // Reread qdict, still pointing to an array
    qdict = pdf.getObjectByObjGen(qdict.getObjGen());
    std::cout << "swapped array: " << qdict.getArrayItem(0).getName() << std::endl;

    // Exercise getAsMap and getAsArray
    std::vector<QPDFObjectHandle> array_elements = qdict.getArrayAsVector();
    std::map<std::string, QPDFObjectHandle> dict_items = qarray.getDictAsMap();
    if ((array_elements.size() == 1) && (array_elements.at(0).getName() == "/Array") &&
        (dict_items.size() == 1) && (dict_items["/NewDict"].getIntValue() == 2)) {
        std::cout << "array and dictionary contents are correct" << std::endl;
    }

    // Exercise writing to memory buffer
    for (int i = 0; i < 2; ++i) {
        QPDFWriter w(pdf);
        w.setOutputMemory();
        // Exercise setOutputMemory with and without static ID
        w.setStaticID(i == 0);
        w.setStreamDataMode(qpdf_s_preserve);
        w.write();
        Buffer* b = w.getBuffer();
        std::string const filename = (i == 0 ? "a.pdf" : "b.pdf");
        FILE* f = QUtil::safe_fopen(filename.c_str(), "wb");
        fwrite(b->getBuffer(), b->getSize(), 1, f);
        fclose(f);
        delete b;
    }
}